

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildConstantLoads(IRBuilder *this)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  TypeId typeId;
  BOOL BVar5;
  JITTimeFunctionBody *pJVar6;
  undefined4 *puVar7;
  intptr_t varConst;
  RegOpnd *dstOpnd;
  ValueType *pVVar8;
  Instr *instr;
  Func *func;
  RegSlot location;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  pJVar6 = Func::GetJITFunctionBody(this->m_func);
  RVar4 = JITTimeFunctionBody::GetConstCount(pJVar6);
  location = 1;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (RVar4 <= location) {
      return;
    }
    pJVar6 = Func::GetJITFunctionBody(this->m_func);
    varConst = JITTimeFunctionBody::GetConstantVar(pJVar6,location);
    if (varConst == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x589,"(varConst != 0)","varConst != 0");
      if (!bVar3) goto LAB_0048cb1f;
      *puVar7 = 0;
    }
    pJVar6 = Func::GetJITFunctionBody(this->m_func);
    typeId = JITTimeFunctionBody::GetConstantType(pJVar6,location);
    dstOpnd = BuildDstOpnd(this,location,TyVar,false,false);
    BVar5 = RegIsConstant(this,location);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x58d,"(this->RegIsConstant(reg))","this->RegIsConstant(reg)");
      if (!bVar3) {
LAB_0048cb1f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    puVar1 = &dstOpnd->m_sym->field_0x18;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40000;
    ValueType::ValueType((ValueType *)&local_32[0].field_0);
    if (typeId == TypeIds_Limit) {
      typeId = TypeIds_Limit;
LAB_0048cad6:
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(typeId,false);
      func = this->m_func;
    }
    else {
      if (typeId == TypeIds_String) {
        pVVar8 = &ValueType::String;
      }
      else {
        if (typeId != TypeIds_Number) goto LAB_0048cad6;
        pVVar8 = &ValueType::Number;
      }
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar8->field_0;
      func = this->m_func;
    }
    instr = IR::Instr::NewConstantLoad
                      (dstOpnd,varConst,(ValueType)local_32[0].field_0,func,(Var)0x0);
    AddInstr(this,instr,0xffffffff);
    location = location + 1;
  } while( true );
}

Assistant:

void
IRBuilder::BuildConstantLoads()
{
    Js::RegSlot count = m_func->GetJITFunctionBody()->GetConstCount();

    for (Js::RegSlot reg = Js::FunctionBody::FirstRegSlot; reg < count; reg++)
    {
        intptr_t varConst = m_func->GetJITFunctionBody()->GetConstantVar(reg);
        Assert(varConst != 0);
        Js::TypeId type = m_func->GetJITFunctionBody()->GetConstantType(reg);

        IR::RegOpnd *dstOpnd = this->BuildDstOpnd(reg);
        Assert(this->RegIsConstant(reg));
        dstOpnd->m_sym->SetIsFromByteCodeConstantTable();
        // TODO: be more precise about this
        ValueType valueType;
        IR::Instr *instr = nullptr;
        switch (type)
        {
        case Js::TypeIds_Number:
            valueType = ValueType::Number;
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func
#if !FLOATVAR
                , m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::JavascriptNumber>(reg) : nullptr
#endif
            );
            break;
        case Js::TypeIds_String:
        {
            valueType = ValueType::String;
            if (m_func->IsOOPJIT())
            {
                // must be either PropertyString or LiteralString
                JITRecyclableObject * jitObj = m_func->GetJITFunctionBody()->GetConstantContent(reg);
                JITJavascriptString * constStr = JITJavascriptString::FromVar(jitObj);
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func, constStr);
            }
            else
            {
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            }
            break;
        }
        case Js::TypeIds_Limit:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            break;
        default:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func,
                m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::RecyclableObject>(reg) : nullptr);
            break;
        }        
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }

}